

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_info.cpp
# Opt level: O3

unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>,_true> __thiscall
duckdb::ArrowListInfo::ListView
          (ArrowListInfo *this,shared_ptr<duckdb::ArrowType,_true> *child,ArrowVariableSizeType size
          )

{
  ArrowListInfo *this_00;
  pointer pAVar1;
  pointer *__ptr;
  shared_ptr<duckdb::ArrowType,_true> local_38;
  
  this_00 = (ArrowListInfo *)operator_new(0x20);
  local_38.internal.super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (child->internal).super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.internal.super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (child->internal).super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  (child->internal).super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (child->internal).super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ArrowListInfo(this_00,&local_38,size);
  (this->super_ArrowTypeInfo)._vptr_ArrowTypeInfo = (_func_int **)this_00;
  if (local_38.internal.super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.internal.super___shared_ptr<duckdb::ArrowType,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pAVar1 = unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>,_true>::
           operator->((unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>,_true>
                       *)this);
  (pAVar1->super_ArrowTypeInfo).field_0xa = 1;
  return (unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>_>)
         (unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>_>)this;
}

Assistant:

unique_ptr<ArrowListInfo> ArrowListInfo::ListView(shared_ptr<ArrowType> child, ArrowVariableSizeType size) {
	D_ASSERT(size == ArrowVariableSizeType::SUPER_SIZE || size == ArrowVariableSizeType::NORMAL);
	auto list_info = unique_ptr<ArrowListInfo>(new ArrowListInfo(std::move(child), size));
	list_info->is_view = true;
	return list_info;
}